

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::Configuration::Configuration
          (Configuration *this,Level level,ConfigurationType configurationType,string *value)

{
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Configuration_00124220;
  this->m_level = level;
  this->m_configurationType = configurationType;
  std::__cxx11::string::string((string *)&this->m_value,(string *)value);
  return;
}

Assistant:

Configuration::Configuration(Level level, ConfigurationType configurationType, const std::string& value) :
  m_level(level),
  m_configurationType(configurationType),
  m_value(value) {
}